

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchBase.h
# Opt level: O1

bool __thiscall SearchBase::isSubtoken(SearchBase *this,string_view strv,string_view subtoken)

{
  long lVar1;
  long lVar2;
  int iVar3;
  char *__s1;
  size_t __n;
  long lVar4;
  
  __s1 = strv._M_str;
  __n = strv._M_len;
  if (1 < __n) {
    lVar4 = 2;
    do {
      if (lVar4 == 0) {
        __n = __n - 2;
        break;
      }
      lVar1 = lVar4 + (__n - 3);
      lVar2 = lVar4 + 9;
      lVar4 = lVar4 + -1;
    } while (__s1[lVar1] == "<a href=\""[lVar2]);
  }
  if (7 < __n) {
    lVar4 = 0;
    do {
      if (lVar4 == -8) {
        __n = __n - 8;
        break;
      }
      lVar1 = lVar4 + (__n - 1);
      lVar2 = lVar4 + 7;
      lVar4 = lVar4 + -1;
    } while (__s1[lVar1] == "&lt;&gt;"[lVar2]);
  }
  if (__n != subtoken._M_len) {
    return false;
  }
  if (__n == 0) {
    return true;
  }
  iVar3 = bcmp(__s1,subtoken._M_str,__n);
  return iVar3 == 0;
}

Assistant:

bool isSubtoken(std::string_view strv, std::string_view subtoken) const {
		removeSuffix(strv, "<>");
		removeSuffix(strv, "&lt;&gt;");

		return strv == subtoken;
	}